

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_0::AsyncStreamFd::write(AsyncStreamFd *this,int __fd,void *__buf,size_t __n)

{
  ArrayPtr<const_int> fds;
  ArrayPtr<const_int> fds_00;
  size_t sVar1;
  ArrayPtr<const_unsigned_char> *pAVar2;
  undefined4 in_register_00000034;
  ArrayPtr<const_unsigned_char> firstPiece;
  ArrayPtr<const_unsigned_char> firstPiece_00;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> morePieces;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> morePieces_00;
  ArrayPtr<const_int> local_88;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> local_78;
  uchar *local_68;
  ArrayPtr<const_unsigned_char> *local_60;
  ArrayPtr<const_int> local_58;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> local_48;
  ArrayPtr<const_unsigned_char> local_38;
  uchar *local_28;
  AsyncStreamFd *this_local;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces_local;
  
  firstPiece.ptr = (uchar *)CONCAT44(in_register_00000034,__fd);
  local_28 = firstPiece.ptr;
  this_local = (AsyncStreamFd *)__buf;
  pieces_local.ptr = (ArrayPtr<const_unsigned_char> *)__n;
  pieces_local.size_ = (size_t)this;
  sVar1 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
  if (sVar1 == 0) {
    ArrayPtr<const_unsigned_char>::ArrayPtr(&local_38,(void *)0x0);
    ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::ArrayPtr(&local_48,(void *)0x0);
    ArrayPtr<const_int>::ArrayPtr(&local_58,(void *)0x0);
    fds.size_ = local_58.size_;
    fds.ptr = local_58.ptr;
    firstPiece.size_ = (size_t)local_38.ptr;
    morePieces.size_ = (size_t)local_48.ptr;
    morePieces.ptr = (ArrayPtr<const_unsigned_char> *)local_38.size_;
    writeInternal(this,firstPiece,morePieces,fds);
  }
  else {
    pAVar2 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::operator[]
                       ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,0);
    local_68 = pAVar2->ptr;
    local_60 = (ArrayPtr<const_unsigned_char> *)pAVar2->size_;
    sVar1 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                      ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
    local_78 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::slice
                         ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,1,sVar1)
    ;
    ArrayPtr<const_int>::ArrayPtr(&local_88,(void *)0x0);
    fds_00.size_ = local_88.size_;
    fds_00.ptr = local_88.ptr;
    firstPiece_00.size_ = (size_t)local_68;
    firstPiece_00.ptr = firstPiece.ptr;
    morePieces_00.size_ = (size_t)local_78.ptr;
    morePieces_00.ptr = local_60;
    writeInternal(this,firstPiece_00,morePieces_00,fds_00);
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    if (pieces.size() == 0) {
      return writeInternal(nullptr, nullptr, nullptr);
    } else {
      return writeInternal(pieces[0], pieces.slice(1, pieces.size()), nullptr);
    }
  }